

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

uint64_t xgetbv(void)

{
  undefined4 in_XCR0;
  undefined4 in_register_00000604;
  uint32_t edx;
  uint32_t eax;
  uint32_t ecx;
  
  return CONCAT44(in_register_00000604,in_XCR0);
}

Assistant:

static WEBP_INLINE uint64_t xgetbv(void) {
  const uint32_t ecx = 0;
  uint32_t eax, edx;
  // Use the raw opcode for xgetbv for compatibility with older toolchains.
  __asm__ volatile (
    ".byte 0x0f, 0x01, 0xd0\n"
    : "=a"(eax), "=d"(edx) : "c" (ecx));
  return ((uint64_t)edx << 32) | eax;
}